

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O2

int __thiscall crnlib::qdxt1::init(qdxt1 *this,EVP_PKEY_CTX *ctx)

{
  vec6F_clusterizer *this_00;
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  dxt_pixel_block *pdVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  uint6 uVar20;
  uint y_1;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  crn_thread_id_t cVar25;
  int iVar26;
  int iVar27;
  void *in_RCX;
  ulong uVar28;
  uint uVar29;
  dxt_pixel_block *in_RDX;
  ulong uVar30;
  uint uVar31;
  uint block_index;
  uint uVar32;
  uint *puVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  color_quad_u8 *pcVar38;
  uint y;
  uint uVar39;
  long lVar40;
  uint uVar41;
  uint x;
  long lVar42;
  mip_desc *pmVar43;
  undefined4 *puVar44;
  uint block_index_1;
  uint uVar45;
  uint e;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  bool bVar49;
  ushort uVar50;
  float fVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [15];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  double dVar58;
  color_quad_u8 h;
  uint local_614;
  float local_610;
  color_quad_u8 l;
  color_quad_u8 c [4];
  undefined4 *local_5a0;
  uint local_588;
  uint encoding_hist [8];
  image_u8 debug_img;
  color_quad_u8 layout_pixels [64];
  color_quad_u8 chunk_pixels [64];
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  selector_hash;
  long local_2c0 [82];
  
  uVar34 = (ulong)ctx & 0xffffffff;
  clear(this);
  cVar25 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar25;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x630);
  this_00 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::reserve
            (&this_00->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  debug_img.m_width = 0;
  debug_img.m_height = 0;
  debug_img.m_pitch = 0;
  debug_img.m_total = 0;
  debug_img.m_comp_flags = 0xf;
  debug_img.m_pixel_buf.m_size = 0;
  debug_img.m_pixel_buf.m_capacity = 0;
  debug_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  debug_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    uVar23 = 0;
    vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::resize
              (&this_00->m_training_vecs,this->m_num_blocks,false);
    auVar56 = ZEXT816(0);
    encoding_hist[4] = auVar56._0_4_;
    encoding_hist[5] = auVar56._4_4_;
    encoding_hist[6] = auVar56._8_4_;
    encoding_hist[7] = auVar56._12_4_;
    encoding_hist[0] = auVar56._0_4_;
    encoding_hist[1] = auVar56._4_4_;
    encoding_hist[2] = auVar56._8_4_;
    encoding_hist[3] = auVar56._12_4_;
    local_614 = 0x200;
    local_5a0 = &DAT_001c4644;
    for (uVar48 = 0; uVar48 < (this->m_params).m_num_mips; uVar48 = uVar48 + 1) {
      uVar2 = (this->m_params).m_mip_desc[uVar48].m_block_width;
      uVar3 = (this->m_params).m_mip_desc[uVar48].m_block_height;
      local_610 = 1.5;
      if (uVar48 != 0) {
        fVar51 = powf(3.1,(float)(uVar48 & 0xffffffff));
        local_610 = 0.25;
        if (0.25 <= 1.5 / fVar51) {
          local_610 = 1.5 / fVar51;
        }
      }
      pmVar43 = (this->m_params).m_mip_desc + uVar48;
      uVar45 = uVar3 * 4 - 1;
      uVar32 = uVar2 * 4 - 1;
      uVar34 = (ulong)uVar32;
      iVar27 = 0;
      for (uVar28 = 0; uVar28 != uVar3 + 1 >> 1; uVar28 = uVar28 + 1) {
        local_588 = (int)uVar28 * 8;
        iVar24 = 0;
        for (uVar36 = 0; uVar36 != uVar2 + 1 >> 1; uVar36 = uVar36 + 1) {
          uVar21 = pmVar43->m_first_block;
          uVar4 = pmVar43->m_block_width;
          pdVar5 = this->m_pBlocks;
          pcVar38 = chunk_pixels;
          for (lVar40 = 0; lVar40 != 8; lVar40 = lVar40 + 1) {
            uVar41 = (uint)lVar40 | local_588;
            if (uVar45 <= uVar41) {
              uVar41 = uVar45;
            }
            for (lVar42 = 0; lVar42 != 8; lVar42 = lVar42 + 1) {
              uVar31 = (uint)lVar42 | (int)uVar36 * 8;
              if (uVar32 <= uVar31) {
                uVar31 = uVar32;
              }
              pcVar38[lVar42].field_0 =
                   *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                    ((long)&pdVar5[(uVar31 >> 2) + (uVar41 >> 2) * uVar4 + uVar21].m_pixels[0]
                            [uVar31 & 3].field_0 + (ulong)((uVar41 & 3) << 4));
            }
            pcVar38 = pcVar38 + 8;
          }
          puVar33 = &selector_hash.m_values.m_size;
          for (lVar40 = 0; lVar40 != 9; lVar40 = lVar40 + 1) {
            uVar41 = (&DAT_001c48d8)[lVar40 * 5];
            iVar22 = (&DAT_001c48dc)[lVar40 * 5];
            uVar31 = (&DAT_001c48d4)[lVar40 * 5] * 8 + (&g_chunk_tile_layouts)[lVar40 * 5];
            uVar29 = 0;
            for (iVar35 = 0; uVar46 = (ulong)uVar41, uVar37 = uVar31, uVar39 = uVar29,
                iVar35 != iVar22; iVar35 = iVar35 + 1) {
              while( true ) {
                bVar49 = uVar46 == 0;
                uVar46 = uVar46 - 1;
                if (bVar49) break;
                layout_pixels[uVar39].field_0 = chunk_pixels[uVar37].field_0;
                uVar39 = uVar39 + 1;
                uVar37 = uVar37 + 1;
              }
              uVar29 = uVar29 + uVar41;
              uVar31 = uVar31 + 8;
            }
            uVar41 = iVar22 * uVar41;
            lVar42 = lVar40 * 0x50;
            dxt_fast::compress_color_block
                      (uVar41,layout_pixels,(uint *)((long)&selector_hash + lVar42),
                       (uint *)((long)&selector_hash + lVar42 + 4),
                       (uint8 *)((long)&selector_hash + lVar42 + 8),false);
            dxt1_block::get_block_colors
                      (c,(uint16)*(uint *)((long)&selector_hash + lVar42),
                       *(uint16 *)((long)&selector_hash + lVar42 + 4));
            pcVar38 = layout_pixels;
            lVar42 = 0;
            for (uVar46 = 0; uVar41 != uVar46; uVar46 = uVar46 + 1) {
              uVar21 = crnlib::color::elucidian_distance
                                 (pcVar38,c + *(byte *)((long)puVar33 + uVar46),false);
              lVar42 = lVar42 + (ulong)uVar21;
              pcVar38 = pcVar38 + 1;
            }
            local_2c0[lVar40 * 10] = lVar42;
            puVar33 = puVar33 + 0x14;
          }
          uVar46 = 0;
          auVar56 = ZEXT816(0xbff0000000000000);
          puVar44 = local_5a0;
          for (uVar47 = 0; uVar47 != 8; uVar47 = uVar47 + 1) {
            dVar52 = auVar56._0_8_;
            dVar58 = 0.0;
            for (lVar40 = 0; (ulong)(uint)(&g_chunk_encodings)[uVar47 * 0x15] * 0x14 - lVar40 != 0;
                lVar40 = lVar40 + 0x14) {
              auVar55._0_8_ =
                   (double)CONCAT44(0x43300000,
                                    (int)local_2c0[(ulong)*(uint *)((long)puVar44 + lVar40) * 10]);
              auVar55._8_4_ =
                   (int)((ulong)local_2c0[(ulong)*(uint *)((long)puVar44 + lVar40) * 10] >> 0x20);
              auVar55._12_4_ = 0x45300000;
              dVar58 = dVar58 + (auVar55._8_8_ - 1.9342813113834067e+25) +
                                (auVar55._0_8_ - 4503599627370496.0);
            }
            dVar58 = dVar58 * 0.0052083334885537624;
            if (dVar58 < 0.0) {
              dVar57 = sqrt(dVar58);
            }
            else {
              dVar57 = SQRT(dVar58);
            }
            dVar53 = 999999.0;
            if ((dVar58 != 0.0) || (NAN(dVar58))) {
              dVar58 = log10(255.0 / dVar57);
              dVar58 = dVar58 * 20.0;
              dVar53 = 500.0;
              if (dVar58 <= 500.0) {
                dVar53 = dVar58;
              }
              dVar53 = (double)(~-(ulong)(dVar58 < 0.0) & (ulong)dVar53);
            }
            dVar53 = dVar53 - (double)(((float)((&g_chunk_encodings)[uVar47 * 0x15] - 1) / 3.0) *
                                       local_610 + 0.0);
            if (dVar52 < dVar53) {
              uVar46 = uVar47 & 0xffffffff;
              dVar52 = dVar53;
            }
            auVar56._8_8_ = 0;
            auVar56._0_8_ = dVar52;
            puVar44 = puVar44 + 0x15;
          }
          encoding_hist[uVar46] = encoding_hist[uVar46] + 1;
          for (uVar47 = 0; uVar47 < (uint)(&g_chunk_encodings)[uVar46 * 0x15]; uVar47 = uVar47 + 1)
          {
            puVar1 = &DAT_001c4634 + uVar46 * 0x15 + uVar47 * 5;
            iVar22 = (&DAT_001c4640)[uVar46 * 0x15 + uVar47 * 5];
            for (iVar35 = 0; iVar35 != iVar22; iVar35 = iVar35 + 1) {
              uVar30 = (ulong)puVar1[2];
              iVar26 = (puVar1[1] + iVar35) * 8;
              uVar41 = puVar1[2] * iVar35;
              while (bVar49 = uVar30 != 0, uVar30 = uVar30 - 1, bVar49) {
                layout_pixels[uVar41].field_0 = chunk_pixels[*puVar1 + iVar26].field_0;
                uVar41 = uVar41 + 1;
                iVar26 = iVar26 + 1;
              }
            }
            dxt_fast::find_representative_colors(iVar22 * puVar1[2],layout_pixels,&l,&h);
            iVar35 = ((uint)l.field_0 & 0xff) - (uint)h.field_0.field_0.r;
            iVar22 = ((uint)l.field_0 >> 8 & 0xff) - (uint)h.field_0.field_0.g;
            uVar31 = ((uint)l.field_0.field_0.b - (uint)h.field_0.field_0.b) *
                     ((uint)l.field_0.field_0.b - (uint)h.field_0.field_0.b) + iVar35 * iVar35 +
                     iVar22 * iVar22;
            uVar29 = 0;
            uVar41 = uVar31 / 5000;
            if (7 < uVar41) {
              uVar41 = 8;
            }
            if (uVar31 < 5000) {
              uVar41 = 1;
            }
            auVar54 = ZEXT115(h.field_0.field_0.r) << 0x18 |
                      (~DAT_00191260._0_15_ & ZEXT115(l.field_0.field_0.b) << 0x10 |
                      ZEXT415((uint)l.field_0) & DAT_00191260._0_15_) & DAT_00191270._0_15_;
            Var9 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar54[3]);
            auVar16._9_6_ = 0;
            auVar16._0_9_ = Var9;
            auVar10._1_10_ = SUB1510(auVar16 << 0x30,5);
            auVar10[0] = auVar54[2];
            auVar17._11_4_ = 0;
            auVar17._0_11_ = auVar10;
            auVar11._1_12_ = SUB1512(auVar17 << 0x20,3);
            auVar11[0] = auVar54[1];
            uVar50 = CONCAT11(0,auVar54[0]);
            auVar8._2_13_ = auVar11;
            auVar8._0_2_ = uVar50;
            auVar6._10_2_ = 0;
            auVar6._0_10_ = auVar8._0_10_;
            auVar6._12_2_ = (short)Var9;
            uVar20 = CONCAT42(auVar6._10_4_,auVar10._0_2_);
            auVar12._6_8_ = 0;
            auVar12._0_6_ = uVar20;
            c[0].field_0 = (float)uVar50;
            c[1].field_0 = (float)(int)CONCAT82(SUB148(auVar12 << 0x40,6),auVar11._0_2_);
            c[2].field_0 = (float)(int)uVar20;
            c[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                           (float)(auVar6._10_4_ >> 0x10);
            iVar22 = iVar27;
            for (; uVar29 < puVar1[3] >> 2; uVar29 = uVar29 + 1) {
              uVar31 = puVar1[1];
              if ((int)uVar28 * 2 + uVar29 + (uVar31 >> 2) < pmVar43->m_block_height) {
                iVar35 = iVar24;
                for (uVar37 = 0; uVar37 < puVar1[2] >> 2; uVar37 = uVar37 + 1) {
                  if (pmVar43->m_block_width <= iVar35 + (*puVar1 >> 2)) break;
                  uVar39 = pmVar43->m_block_width * ((uVar31 >> 2) + iVar22) + iVar35 +
                           (*puVar1 >> 2) + pmVar43->m_first_block;
                  vec<6U,_float>::operator=
                            (&(this_00->m_training_vecs).m_p[uVar39].first,(vec<6U,_float> *)c);
                  (this_00->m_training_vecs).m_p[uVar39].second = uVar41;
                  iVar35 = iVar35 + 1;
                }
                uVar23 = uVar23 + uVar37;
              }
              iVar22 = iVar22 + 1;
            }
          }
          if (local_614 <= uVar23) {
            bVar49 = update_progress(this,uVar23,this->m_num_blocks - 1);
            if (!bVar49) goto LAB_001375d9;
            local_614 = local_614 + 0x200;
          }
          iVar24 = iVar24 + 2;
        }
        iVar27 = iVar27 + 2;
      }
    }
  }
  else {
    lVar40 = 0;
    for (uVar34 = 0; uVar34 < this->m_num_blocks; uVar34 = uVar34 + 1) {
      if (((uVar34 & 0x1ff) == 0) &&
         (bVar49 = update_progress(this,(uint)uVar34,this->m_num_blocks - 1), !bVar49))
      goto LAB_001375d9;
      dxt_fast::find_representative_colors
                (0x10,(color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar40),
                 chunk_pixels,layout_pixels);
      iVar27 = ((uint)chunk_pixels[0].field_0 & 0xff) - (uint)(byte)layout_pixels[0].field_0._0_1_;
      iVar22 = ((uint)chunk_pixels[0].field_0 >> 8 & 0xff) -
               (uint)(byte)layout_pixels[0].field_0._1_1_;
      iVar24 = (uint)(byte)chunk_pixels[0].field_0._2_1_ -
               (uint)(byte)layout_pixels[0].field_0._2_1_;
      uVar32 = iVar24 * iVar24 + iVar27 * iVar27 + iVar22 * iVar22;
      uVar23 = uVar32 / 5000;
      if (7 < uVar23) {
        uVar23 = 8;
      }
      if (uVar32 < 5000) {
        uVar23 = 1;
      }
      auVar54 = ZEXT115((byte)layout_pixels[0].field_0._0_1_) << 0x18 |
                (~DAT_00191260._0_15_ & ZEXT115((byte)chunk_pixels[0].field_0._2_1_) << 0x10 |
                ZEXT415((uint)chunk_pixels[0].field_0) & DAT_00191260._0_15_) & DAT_00191270._0_15_;
      Var9 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar54[3]);
      auVar18._9_6_ = 0;
      auVar18._0_9_ = Var9;
      auVar13._1_10_ = SUB1510(auVar18 << 0x30,5);
      auVar13[0] = auVar54[2];
      auVar19._11_4_ = 0;
      auVar19._0_11_ = auVar13;
      auVar14._1_12_ = SUB1512(auVar19 << 0x20,3);
      auVar14[0] = auVar54[1];
      uVar50 = CONCAT11(0,auVar54[0]);
      auVar54._2_13_ = auVar14;
      auVar54._0_2_ = uVar50;
      auVar7._10_2_ = 0;
      auVar7._0_10_ = auVar54._0_10_;
      auVar7._12_2_ = (short)Var9;
      uVar20 = CONCAT42(auVar7._10_4_,auVar13._0_2_);
      auVar15._6_8_ = 0;
      auVar15._0_6_ = uVar20;
      selector_hash.m_values.m_p =
           (raw_node *)
           CONCAT44((float)(int)CONCAT82(SUB148(auVar15 << 0x40,6),auVar14._0_2_),(float)uVar50);
      selector_hash.m_values.m_capacity = (uint)(float)(auVar7._10_4_ >> 0x10);
      selector_hash.m_values.m_size = (uint)(float)(int)uVar20;
      selector_hash.m_hash_shift = (uint)(float)(byte)layout_pixels[0].field_0._1_1_;
      selector_hash._20_4_ = (BADTYPE)(byte)layout_pixels[0].field_0._2_1_;
      clusterizer<crnlib::vec<6U,_float>_>::add_training_vec
                (this_00,(vec<6U,_float> *)&selector_hash,uVar23);
      lVar40 = lVar40 + 0x40;
    }
  }
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  bVar49 = clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                     (this_00,0xffff,generate_codebook_progress_callback,this,false);
  if (bVar49) {
    selector_hash.m_values.m_p = (raw_node *)0x0;
    selector_hash.m_values.m_size = 0;
    selector_hash.m_values.m_capacity = 0;
    selector_hash.m_hash_shift = 0x20;
    selector_hash.m_num_valid = 0;
    selector_hash.m_grow_threshold = 0;
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    lVar40 = 0;
    uVar48 = 0;
    while( true ) {
      bVar49 = this->m_num_blocks <= uVar48;
      uVar34 = CONCAT71((int7)(uVar34 >> 8),bVar49);
      iVar27 = (int)uVar34;
      if (bVar49) break;
      if (((uVar48 & 0x1ff) == 0) &&
         (bVar49 = update_progress(this,(uint)uVar48,this->m_num_blocks - 1), !bVar49))
      goto LAB_001375f7;
      dxt_fast::compress_color_block
                ((dxt1_block *)layout_pixels,
                 (color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar40),false);
      encoding_hist[0] = (uint)layout_pixels[1].field_0;
      hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert((insert_result *)chunk_pixels,&selector_hash,encoding_hist,(empty_type *)c);
      uVar48 = uVar48 + 1;
      lVar40 = lVar40 + 0x40;
    }
    this->m_max_selector_clusters = selector_hash.m_num_valid + 0x80;
    update_progress(this,1,1);
LAB_001375f7:
    hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map(&selector_hash);
  }
  else {
LAB_001375d9:
    iVar27 = 0;
  }
  vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&debug_img.m_pixel_buf);
  return iVar27;
}

Assistant:

bool qdxt1::init(uint n, const dxt_pixel_block* pBlocks, const qdxt1_params& params) {
  clear();

  CRNLIB_ASSERT(n && pBlocks);

  m_main_thread_id = crn_get_current_thread_id();

  m_num_blocks = n;
  m_pBlocks = pBlocks;
  m_params = params;

  m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

  m_progress_start = 0;
  m_progress_range = 75;

  const bool debugging = false;
  image_u8 debug_img;

  if ((m_params.m_hierarchical) && (m_params.m_num_mips)) {
    vec6F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
    training_vecs.resize(m_num_blocks);

    uint encoding_hist[cNumChunkEncodings];
    utils::zero_object(encoding_hist);

    uint total_processed_blocks = 0;
    uint next_progress_threshold = 512;

    for (uint level = 0; level < m_params.m_num_mips; level++) {
      const qdxt1_params::mip_desc& level_desc = m_params.m_mip_desc[level];

      const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
      const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

      const uint level_width = level_desc.m_block_width * 4;
      const uint level_height = level_desc.m_block_height * 4;

      if (debugging)
        debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);

      float adaptive_tile_color_psnr_derating = 1.5f;  // was 2.4f
      if ((level) && (adaptive_tile_color_psnr_derating > .25f)) {
        adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.1f, static_cast<float>(level)));  // was 3.0f
      }
      for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++) {
        for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++) {
          color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

          for (uint y = 0; y < cChunkPixelHeight; y++) {
            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

            for (uint x = 0; x < cChunkPixelWidth; x++) {
              const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

              const uint block_index = outer_block_index + (pix_x >> 2);

              const dxt_pixel_block& block = m_pBlocks[block_index];

              const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

              chunk_pixels[x + y * 8] = p;
            }
          }

          struct layout_results {
            uint m_low_color;
            uint m_high_color;
            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
            uint64 m_error;
            //float m_penalty;
          };
          layout_results layouts[cNumChunkTileLayouts];

          for (uint l = 0; l < cNumChunkTileLayouts; l++) {
            const uint width = g_chunk_tile_layouts[l].m_width;
            const uint height = g_chunk_tile_layouts[l].m_height;
            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
            for (uint y = 0; y < height; y++)
              for (uint x = 0; x < width; x++)
                layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];

            const uint n = width * height;
            dxt_fast::compress_color_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors);

            color_quad_u8 c[4];
            dxt1_block::get_block_colors(c, static_cast<uint16>(layouts[l].m_low_color), static_cast<uint16>(layouts[l].m_high_color));

            uint64 error = 0;
            for (uint i = 0; i < n; i++)
              error += color::elucidian_distance(layout_pixels[i], c[layouts[l].m_selectors[i]], false);

            layouts[l].m_error = error;

#if 0
                     if ((width > 4) || (height > 4))
                     {
                        const uint dist = color::elucidian_distance(
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_low_color), true),
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_high_color), true), false);

                        layouts[l].m_penalty = math::clamp((sqrt((float)dist) - 75.0f) / 150.0f, 0.0f, 2.0f);
                        if ((width == 8) && (height == 8))
                           layouts[l].m_penalty *= 2.0f;
                     }
                     else
                     {
                        layouts[l].m_penalty = 0.0f;
                     }
#endif
          }

          double best_peak_snr = -1.0f;
          uint best_encoding = 0;

          for (uint e = 0; e < cNumChunkEncodings; e++) {
            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

            double total_error = 0;

            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
              total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;

            //double mean_squared = total_error * (1.0f / (16.0f * 3.0f));
            double mean_squared = total_error * (1.0f / (64.0f * 3.0f));
            double root_mean_squared = sqrt(mean_squared);

            double peak_snr = 999999.0f;
            if (mean_squared)
              peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);

            //if (level)
            //   adaptive_tile_color_psnr_derating = math::lerp(adaptive_tile_color_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));

            float color_derating = math::lerp(0.0f, adaptive_tile_color_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
            peak_snr = peak_snr - color_derating;

            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

            if (peak_snr > best_peak_snr) {
              best_peak_snr = peak_snr;
              best_encoding = e;
            }
          }

          encoding_hist[best_encoding]++;

          const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

          for (uint t = 0; t < encoding_desc.m_num_tiles; t++) {
            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

            uint layout_index = tile_desc.m_layout_index;
            const layout_results& layout = layouts[layout_index];
            color_quad_u8 c[4];
            if (debugging)
              dxt1_block::get_block_colors(c, static_cast<uint16>(layout.m_low_color), static_cast<uint16>(layout.m_high_color));

            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

            for (uint y = 0; y < tile_desc.m_height; y++) {
              const uint pix_y = y + tile_desc.m_y_ofs;

              for (uint x = 0; x < tile_desc.m_width; x++) {
                const uint pix_x = x + tile_desc.m_x_ofs;

                tile_pixels[x + y * tile_desc.m_width] = chunk_pixels[pix_x + pix_y * cChunkPixelWidth];

                if (debugging)
                  debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
              }
            }

            color_quad_u8 l, h;
            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

            //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
            const uint dist = color::elucidian_distance(l, h, false);

            const uint cColorDistToWeight = 5000;
            const uint cMaxWeight = 8;
            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

            vec6F ev;

            ev[0] = l[0];
            ev[1] = l[1];
            ev[2] = l[2];
            ev[3] = h[0];
            ev[4] = h[1];
            ev[5] = h[2];

            for (uint y = 0; y < (tile_desc.m_height >> 2); y++) {
              uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
              if (block_y >= level_desc.m_block_height)
                continue;

              for (uint x = 0; x < (tile_desc.m_width >> 2); x++) {
                uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                if (block_x >= level_desc.m_block_width)
                  break;

                uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                training_vecs[block_index].first = ev;
                training_vecs[block_index].second = weight;

                total_processed_blocks++;

                //if (debugging)
                //{
                //   debug_img(block_x, block_y) = l;
                //   debug_img(block_x + level_desc.m_block_width, block_y) = h;
                //}

              }  // x
            }    // y
          }      //t

          if (total_processed_blocks >= next_progress_threshold) {
            next_progress_threshold += 512;

            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
              return false;
          }

        }  // chunk_x
      }    // chunk_y

#if GENERATE_DEBUG_IMAGES
      if (debugging)
        image_utils::write_to_file(dynamic_string(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

    }  // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
  } else {
    for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
      if ((block_index & 511) == 0) {
        if (!update_progress(block_index, m_num_blocks - 1))
          return false;
      }

      color_quad_u8 l, h;
      dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, &m_pBlocks[block_index].m_pixels[0][0], l, h);

      //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
      const uint dist = color::elucidian_distance(l, h, false);

      const uint cColorDistToWeight = 5000;
      const uint cMaxWeight = 8;
      uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

      vec6F ev;

      ev[0] = l[0];
      ev[1] = l[1];
      ev[2] = l[2];
      ev[3] = h[0];
      ev[4] = h[1];
      ev[5] = h[2];

      m_endpoint_clusterizer.add_training_vec(ev, weight);
    }
  }

  const uint cMaxEndpointClusters = 65535U;

  m_progress_start = 75;
  m_progress_range = 20;

  if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
    return false;

  crnlib::hash_map<uint, empty_type> selector_hash;

  m_progress_start = 95;
  m_progress_range = 5;

  for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
    if ((block_index & 511) == 0) {
      if (!update_progress(block_index, m_num_blocks - 1))
        return false;
    }

    dxt1_block dxt_blk;
    dxt_fast::compress_color_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0]);

    uint selectors = dxt_blk.m_selectors[0] | (dxt_blk.m_selectors[1] << 8) | (dxt_blk.m_selectors[2] << 16) | (dxt_blk.m_selectors[3] << 24);

    selector_hash.insert(selectors);
  }

  m_max_selector_clusters = selector_hash.size() + 128;

  //      trace("max endpoint clusters: %u\n", m_endpoint_clusterizer.get_codebook_size());
  //      trace("max selector clusters: %u\n", m_max_selector_clusters);

  update_progress(1, 1);

  return true;
}